

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O3

QSizeF viewItemTextLayout(QTextLayout *textLayout,int lineWidth,int maxHeight,int *lastVisibleLine)

{
  undefined4 uVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar2;
  long in_FS_OFFSET;
  double dVar3;
  QSizeF QVar4;
  double local_78;
  double local_70;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lastVisibleLine != (int *)0x0) {
    *lastVisibleLine = -1;
  }
  QTextLayout::beginLayout();
  local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  uVar1 = QTextLayout::createLine();
  local_48.xp = (qreal)CONCAT44(local_48.xp._4_4_,uVar1);
  local_48.yp = (qreal)CONCAT44(extraout_var,extraout_EDX);
  if (CONCAT44(extraout_var,extraout_EDX) == 0) {
    local_70 = 0.0;
    local_78 = 0.0;
  }
  else {
    local_78 = 0.0;
    uVar2 = 0;
    local_70 = 0.0;
    do {
      QTextLine::setLineWidth((double)lineWidth);
      QTextLine::setPosition(&local_48);
      dVar3 = (double)QTextLine::height();
      local_78 = dVar3 + local_78;
      dVar3 = (double)QTextLine::naturalTextWidth();
      if (dVar3 <= local_70) {
        dVar3 = local_70;
      }
      local_70 = dVar3;
      if ((0 < maxHeight && lastVisibleLine != (int *)0x0) &&
         (dVar3 = (double)QTextLine::height(), (double)maxHeight < dVar3 + local_78)) {
        QTextLayout::createLine();
        *lastVisibleLine = -(uint)(CONCAT44(extraout_var_01,extraout_EDX_01) == 0) | uVar2;
        break;
      }
      uVar2 = uVar2 + 1;
      local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_48.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      uVar1 = QTextLayout::createLine();
      local_48.xp = (qreal)CONCAT44(local_48.xp._4_4_,uVar1);
      local_48.yp = (qreal)CONCAT44(extraout_var_00,extraout_EDX_00);
    } while (CONCAT44(extraout_var_00,extraout_EDX_00) != 0);
  }
  QTextLayout::endLayout();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar4.ht = local_78;
  QVar4.wd = local_70;
  return QVar4;
}

Assistant:

static QSizeF viewItemTextLayout(QTextLayout &textLayout, int lineWidth, int maxHeight = -1, int *lastVisibleLine = nullptr)
{
    if (lastVisibleLine)
        *lastVisibleLine = -1;
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    int i = 0;
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
        // we assume that the height of the next line is the same as the current one
        if (maxHeight > 0 && lastVisibleLine && height + line.height() > maxHeight) {
            const QTextLine nextLine = textLayout.createLine();
            *lastVisibleLine = nextLine.isValid() ? i : -1;
            break;
        }
        ++i;
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}